

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::lcg64_&,_const_trng::lcg64_&> * __thiscall
Catch::ExprLhs<trng::lcg64_const&>::operator==
          (BinaryExpr<const_trng::lcg64_&,_const_trng::lcg64_&> *__return_storage_ptr__,
          ExprLhs<trng::lcg64_const&> *this,lcg64 *rhs)

{
  lcg64 *plVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = trng::operator==(*(lcg64 **)this,rhs);
  plVar1 = *(lcg64 **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002e9ae8;
  __return_storage_ptr__->m_lhs = plVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }